

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guild.cpp
# Opt level: O2

void __thiscall Guild::DelMember(Guild *this,string *kicked,Character *kicker,bool alert)

{
  World *pWVar1;
  long lVar2;
  long *plVar3;
  bool bVar4;
  __type _Var5;
  mapped_type *this_00;
  undefined7 in_register_00000009;
  _List_node_base *p_Var6;
  const_iterator __position;
  long *plVar7;
  list<Client_*,_std::allocator<Client_*>_> *plVar8;
  allocator local_119;
  string msg;
  string local_f8;
  World *local_d8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  Database_Result local_50;
  
  util::lowercase(&msg,kicked);
  std::__cxx11::string::operator=((string *)kicked,(string *)&msg);
  std::__cxx11::string::~string((string *)&msg);
  if ((int)CONCAT71(in_register_00000009,alert) != 0) {
    pWVar1 = this->manager->world;
    std::__cxx11::string::string((string *)&msg,"GuildAnnounce",(allocator *)&local_f8);
    this_00 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&pWVar1->config,&msg);
    bVar4 = util::variant::GetBool(this_00);
    std::__cxx11::string::~string((string *)&msg);
    if (bVar4) {
      pWVar1 = this->manager->world;
      std::__cxx11::string::string((string *)&local_f8,"guild_leave",(allocator *)&local_b0);
      util::ucfirst(&local_d0,kicked);
      I18N::Format<std::__cxx11::string>(&msg,&pWVar1->i18n,&local_f8,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f8);
      if (kicker != (Character *)0x0) {
        pWVar1 = this->manager->world;
        std::__cxx11::string::string((string *)&local_b0,"guild_kick",&local_119);
        util::ucfirst(&local_70,&kicker->real_name);
        I18N::Format<std::__cxx11::string>(&local_d0,&pWVar1->i18n,&local_b0,&local_70);
        std::operator+(&local_f8," ",&local_d0);
        std::__cxx11::string::append((string *)&msg);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_b0);
      }
      std::__cxx11::string::string((string *)&local_90,(string *)&msg);
      Msg(this,(Character *)0x0,&local_90,true);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&msg);
    }
  }
  __position._M_current =
       (this->members).
       super__Vector_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (__position._M_current ==
        (this->members).
        super__Vector_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00193579:
      local_d8 = this->manager->world;
      plVar8 = &(local_d8->server->super_Server).clients;
      p_Var6 = (_List_node_base *)plVar8;
LAB_00193594:
      do {
        do {
          p_Var6 = (((_List_base<Client_*,_std::allocator<Client_*>_> *)&p_Var6->_M_next)->_M_impl).
                   _M_node.super__List_node_base._M_next;
          if (p_Var6 == (_List_node_base *)plVar8) {
            Database::Query(&local_50,&local_d8->db,
                            "UPDATE `characters` SET `guild` = NULL, `guild_rank` = NULL, `guild_rank_string` = NULL WHERE `name` = \'$\'"
                            ,(kicked->_M_dataplus)._M_p);
            std::
            vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
            ::~vector(&local_50.
                       super_vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
                     );
            return;
          }
          lVar2 = *(long *)((long)p_Var6[1]._M_next + 0x108);
        } while (lVar2 == 0);
        plVar7 = *(long **)(lVar2 + 0x50);
        plVar3 = *(long **)(lVar2 + 0x58);
        do {
          if (plVar7 == plVar3) goto LAB_00193594;
          lVar2 = *plVar7;
          _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(lVar2 + 0x18),kicked);
          plVar7 = plVar7 + 1;
        } while (!_Var5);
        std::__shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>::reset
                  ((__shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2> *)(lVar2 + 1000));
        *(undefined1 *)(lVar2 + 0x408) = 0;
        *(undefined8 *)(lVar2 + 0x418) = 0;
        **(undefined1 **)(lVar2 + 0x410) = 0;
        if (*(char *)(lVar2 + 0xc) != '\0') {
          return;
        }
      } while( true );
    }
    std::__shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2> *)&msg,
               &(__position._M_current)->
                super___shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2>);
    _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            msg._M_dataplus._M_p,kicked);
    if (_Var5) {
      std::vector<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>::
      erase(&this->members,__position);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&msg._M_string_length);
      goto LAB_00193579;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&msg._M_string_length);
    __position._M_current = __position._M_current + 1;
  } while( true );
}

Assistant:

void Guild::DelMember(std::string kicked, Character *kicker, bool alert)
{
	kicked = util::lowercase(kicked);

	if (alert && this->manager->world->config["GuildAnnounce"])
	{
		std::string msg = manager->world->i18n.Format("guild_leave", util::ucfirst(kicked));

		if (kicker)
			msg += " " + manager->world->i18n.Format("guild_kick", util::ucfirst(kicker->real_name));

		this->Msg(0, msg);
	}

	UTIL_IFOREACH(this->members, it)
	{
		std::shared_ptr<Guild_Member> member = *it;

		if (member->name == kicked)
		{
			this->members.erase(it);
			break;
		}
	}

	World* world = this->manager->world;

	UTIL_FOREACH(world->server->clients, client)
	{
		EOClient *eoclient = static_cast<EOClient *>(client);

		if (eoclient->player)
		{
			UTIL_FOREACH(eoclient->player->characters, character)
			{
				if (character->real_name == kicked)
				{
					character->guild.reset();
					character->guild_rank = 0;
					character->guild_rank_string.clear();
					// *this may not be valid after this point

					if (character->online)
						return;
					else
						break;
				}
			}
		}
	}

	world->db.Query("UPDATE `characters` SET `guild` = NULL, `guild_rank` = NULL, `guild_rank_string` = NULL WHERE `name` = '$'", kicked.c_str());
}